

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  ushort uVar4;
  bool bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  int iVar8;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar9;
  long lVar10;
  uint unaff_EBP;
  uint i;
  long lVar11;
  int iVar12;
  run_container_t *prVar13;
  uint uVar14;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  uVar4 = (ushort)(val >> 0x10);
  iVar8 = (r->high_low_container).size;
  if (((long)iVar8 == 0) ||
     (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar8 + -1] == uVar4)) {
    i = iVar8 - 1;
  }
  else {
    iVar12 = iVar8 + -1;
    uVar14 = 0;
    do {
      if (iVar12 < (int)uVar14) {
        i = ~uVar14;
        break;
      }
      i = uVar14 + iVar12 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar14 + iVar12 & 0xfffffffe));
      if (uVar1 < uVar4) {
        uVar14 = i + 1;
        bVar5 = true;
        i = unaff_EBP;
      }
      else if (uVar4 < uVar1) {
        iVar12 = i - 1;
        bVar5 = true;
        i = unaff_EBP;
      }
      else {
        bVar5 = false;
      }
      unaff_EBP = i;
    } while (bVar5);
  }
  if (-1 < (int)i) {
    if (iVar8 <= (int)(i & 0xffff)) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    uVar14 = i & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar14];
    uStack_38 = in_RAX;
    if (puVar3[uVar14] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar14);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar14 * 8)) = sc;
    uVar7 = (r->high_low_container).typecodes[uVar14];
    prVar13 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar14 * 8));
    uStack_38._7_1_ = uVar7;
    prVar9 = (run_container_t *)
             container_remove(prVar13,(uint16_t)val,uVar7,(uint8_t *)((long)&uStack_38 + 7));
    if (prVar9 != prVar13) {
      container_free(prVar13,uVar7);
      if ((r->high_low_container).size <= (int)i) goto LAB_001141c1;
      (r->high_low_container).containers[i] = prVar9;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
    }
    uVar6 = uStack_38._7_1_;
    prVar13 = prVar9;
    uVar7 = uStack_38._7_1_;
    if (uStack_38._7_1_ == '\x04') {
      uVar7 = *(uint8_t *)&prVar9->runs;
      if (uVar7 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      prVar13 = *(run_container_t **)prVar9;
    }
    if (uVar7 == '\x03') {
      lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar10 + 4) & 0x20) == 0) {
        iVar8 = prVar13->n_runs;
        lVar10 = (long)iVar8;
        if (0 < lVar10) {
          lVar11 = 0;
          do {
            iVar8 = iVar8 + (uint)prVar13->runs[lVar11].length;
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
      }
      else {
        iVar8 = _avx2_run_container_cardinality(prVar13);
      }
    }
    else {
      if ((uVar7 != '\x02') && (uVar7 != '\x01')) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
      }
      iVar8 = prVar13->n_runs;
    }
    if (iVar8 == 0) {
      container_free((r->high_low_container).containers[i],(r->high_low_container).typecodes[i]);
      ra_remove_at_index(&r->high_low_container,i);
    }
    else {
      if ((r->high_low_container).size <= (int)i) {
LAB_001141c1:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (r->high_low_container).containers[i] = prVar9;
      (r->high_low_container).typecodes[i] = uVar6;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}